

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>::cleanup
          (SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *this,
          EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  __destroy_fn *unaff_retaddr;
  
  std::ranges::__destroy_fn::
  operator()<slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>_&>
            (unaff_retaddr,this);
  bVar1 = isSmall(this);
  if (!bVar1) {
    operator_delete((void *)0x92904a);
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }